

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.c
# Opt level: O1

char * statemachine_stop_record(statemachine_ctx *ctx)

{
  if (ctx == (statemachine_ctx *)0x0) {
    __assert_fail("ctx != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/build_O1/src/tests/statemachine.c"
                  ,0x13c,"const char *statemachine_stop_record(statemachine_ctx *)");
  }
  if (ctx->recording != 0) {
    ctx->record_buffer[ctx->record_pos] = '\0';
    ctx->recording = 0;
    return ctx->record_buffer;
  }
  __assert_fail("ctx->recording",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/build_O1/src/tests/statemachine.c"
                ,0x13d,"const char *statemachine_stop_record(statemachine_ctx *)");
}

Assistant:

const char *statemachine_stop_record(statemachine_ctx *ctx)
{
    assert(ctx != NULL);
    assert(ctx->recording);
    ctx->record_buffer[ctx->record_pos] = '\0';
    ctx->recording = 0;
    return ctx->record_buffer;
}